

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenStructConstructor
          (CppGenerator *this,StructDef *struct_def,GenArrayArgMode array_mode)

{
  uint uVar1;
  Value *type;
  BaseType BVar2;
  BaseType BVar3;
  FieldDef *field;
  pointer pcVar4;
  long lVar5;
  long *plVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  long *plVar9;
  size_type *psVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  StructDef *pSVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer ppFVar17;
  bool bVar18;
  bool bVar19;
  string scalar_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name;
  int padding_id;
  string arg_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_name;
  string init_list;
  _Any_data local_298;
  undefined1 local_288 [16];
  string local_278;
  CodeWriter *local_258;
  CppGenerator *local_250;
  string local_248;
  GenArrayArgMode local_228;
  int local_224;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  StructDef *local_200;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  string local_118;
  string local_f8;
  pointer local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_220 = &local_210;
  local_218 = 0;
  local_210 = 0;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  local_224 = 0;
  ppFVar17 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_250 = this;
  local_228 = array_mode;
  local_200 = struct_def;
  if (ppFVar17 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar15 = 0;
    local_d8 = ppFVar17;
    do {
      field = *(FieldDef **)((long)ppFVar17 + lVar15);
      BVar2 = (field->value).type.base_type;
      Name_abi_cxx11_((string *)&local_298,local_250,field);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x36b1d9);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_278.field_2._M_allocated_capacity = *puVar8;
        local_278.field_2._8_8_ = plVar6[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar8;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288) {
        operator_delete(local_298._M_unused._M_object,(ulong)(local_288._0_8_ + 1));
      }
      type = &field->value;
      local_258 = (CodeWriter *)
                  CONCAT71(local_258._1_7_,
                           BVar2 != BASE_TYPE_ARRAY || local_228 != kArrayArgModeNone);
      if (BVar2 != BASE_TYPE_ARRAY || local_228 != kArrayArgModeNone) {
        if ((lVar15 != 0) && (local_218 != 0)) {
          std::__cxx11::string::append((char *)&local_220);
        }
        if (BVar2 == BASE_TYPE_ARRAY) {
          GenTypeSpan_abi_cxx11_
                    ((string *)&local_298,local_250,&type->type,true,
                     (ulong)(field->value).type.fixed_length);
        }
        else {
          GenTypeGet_abi_cxx11_((string *)&local_298,local_250,&type->type," ","const "," &",true);
        }
        std::__cxx11::string::_M_append((char *)&local_220,local_298._M_unused._M_member_pointer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288) {
          operator_delete(local_298._M_unused._M_object,(ulong)(local_288._0_8_ + 1));
        }
        std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_278._M_dataplus._M_p);
      }
      if ((local_228 == kArrayArgModeNone) || (BVar2 != BASE_TYPE_ARRAY)) {
        if ((lVar15 != 0) && (local_198._M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_198);
        }
        Name_abi_cxx11_(&local_248,local_250,field);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
        plVar9 = plVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar9) {
          local_288._0_8_ = *plVar9;
          local_288._8_8_ = plVar6[3];
          local_298._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_288;
        }
        else {
          local_288._0_8_ = *plVar9;
          local_298._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_298._8_8_ = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_198,local_298._M_unused._M_member_pointer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288) {
          operator_delete(local_298._M_unused._M_object,(ulong)(local_288._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        BVar3 = (type->type).base_type;
        if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
          GenUnderlyingCast((string *)&local_298,local_250,field,false,&local_278);
          std::operator+(&local_1d8,"(::flatbuffers::EndianScalar(",(string *)&local_298);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          plVar9 = plVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar9) {
            local_248.field_2._M_allocated_capacity = *plVar9;
            local_248.field_2._8_8_ = plVar6[3];
          }
          else {
            local_248.field_2._M_allocated_capacity = *plVar9;
            local_248._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_248._M_string_length = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_248._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,
                            (ulong)(local_248.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          uVar11 = local_288._0_8_;
          uVar12 = local_298._M_unused._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_unused._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288) {
LAB_00185072:
            operator_delete((void *)uVar12,(ulong)(uVar11 + 1));
          }
        }
        else {
          if (((char)local_258 != '\0') &&
             ((BVar3 != BASE_TYPE_STRUCT || (((field->value).type.struct_def)->fixed == false)))) {
            __assert_fail("(is_array && !init_arrays) || IsStruct(type)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0xf18,
                          "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                         );
          }
          if (BVar2 == BASE_TYPE_ARRAY) {
            std::__cxx11::string::append((char *)&local_198);
          }
          else {
            std::operator+(&local_248,"(",&local_278);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
            plVar9 = plVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar9) {
              local_288._0_8_ = *plVar9;
              local_288._8_8_ = plVar6[3];
              local_298._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_288;
            }
            else {
              local_288._0_8_ = *plVar9;
              local_298._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_298._8_8_ = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_198,local_298._M_unused._M_member_pointer);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_unused._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288) {
              operator_delete(local_298._M_unused._M_object,(ulong)(local_288._0_8_ + 1));
            }
            uVar11 = local_248.field_2._M_allocated_capacity;
            uVar12 = local_248._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_00185072;
          }
        }
      }
      ppFVar17 = local_d8;
      if (field->padding != 0) {
        local_298._8_8_ = 0;
        local_298._M_unused._M_object = PaddingInitializer;
        local_288._8_8_ =
             std::
             _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
             ::_M_invoke;
        local_288._0_8_ =
             std::
             _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
             ::_M_manager;
        GenPadding(field,&local_198,&local_224,
                   (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                    *)&local_298);
        if ((code *)local_288._0_8_ != (code *)0x0) {
          (*(code *)local_288._0_8_)(&local_298,&local_298,3);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar15 + 8;
      lVar15 = lVar15 + 8;
    } while ((pointer)((long)ppFVar17 + lVar5) !=
             (local_200->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_218 != 0) {
    paVar16 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"ARG_LIST","");
    local_258 = &local_250->code_;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_258->value_map_,&local_278);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar16) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"INIT_LIST","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_258->value_map_,&local_278);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar16) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_198._M_string_length == 0) {
      paVar16 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"  {{STRUCT_NAME}}({{ARG_LIST}}) {","");
      CodeWriter::operator+=(local_258,&local_70);
      _Var13._M_p = local_70._M_dataplus._M_p;
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"  {{STRUCT_NAME}}({{ARG_LIST}})","");
      CodeWriter::operator+=(local_258,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      paVar16 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"      : {{INIT_LIST}} {","");
      CodeWriter::operator+=(local_258,&local_50);
      _Var13._M_p = local_50._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != paVar16) {
      operator_delete(_Var13._M_p,paVar16->_M_allocated_capacity + 1);
    }
    local_224 = 0;
    pSVar14 = (StructDef *)
              (local_200->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_200 = (StructDef *)
                (local_200->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar14 != local_200) {
      do {
        if ((local_228 != kArrayArgModeNone) &&
           (pcVar4 = (pSVar14->super_Definition).name._M_dataplus._M_p,
           *(int *)(pcVar4 + 200) == 0x11)) {
          bVar19 = *(long *)(pcVar4 + 0xd8) != 0;
          uVar1 = *(int *)(pcVar4 + 0xcc) - 1;
          bVar18 = uVar1 < 10;
          if ((0xb < uVar1) &&
             ((*(int *)(pcVar4 + 0xcc) != 0xf ||
              (*(char *)(*(long *)(pcVar4 + 0xd0) + 0x110) != '\x01')))) {
            __assert_fail("(IsScalar(element_type.base_type) || IsStruct(element_type)) && \"invalid declaration\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0xf34,
                          "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                         );
          }
          GenTypeGet_abi_cxx11_
                    (&local_278,local_250,(Type *)(pcVar4 + 200)," ","","",bVar18 && bVar19);
          if (bVar18 && bVar19) {
            std::operator+(&local_248,"CastToArrayOfEnum<",&local_278);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
            local_298._M_unused._M_object = local_288;
            plVar9 = plVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar9) {
              local_288._0_8_ = *plVar9;
              local_288._8_8_ = plVar6[3];
            }
            else {
              local_288._0_8_ = *plVar9;
              local_298._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_298._8_8_ = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
          }
          else {
            local_298._M_unused._M_object = local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CastToArray","");
          }
          if ((bVar18 && bVar19) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2)) {
            operator_delete(local_248._M_dataplus._M_p,
                            (ulong)(local_248.field_2._M_allocated_capacity + 1));
          }
          Name_abi_cxx11_(&local_1f8,local_250,
                          (FieldDef *)(pSVar14->super_Definition).name._M_dataplus._M_p);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1d8.field_2._M_allocated_capacity = *psVar10;
            local_1d8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1d8.field_2._M_allocated_capacity = *psVar10;
            local_1d8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1d8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          Name_abi_cxx11_(&local_1b8,local_250,
                          (FieldDef *)(pSVar14->super_Definition).name._M_dataplus._M_p);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x36b1d9);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1f8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_b0,"    ::flatbuffers::",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_298);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_178 = &local_168;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_168 = *plVar9;
            lStack_160 = plVar6[3];
          }
          else {
            local_168 = *plVar9;
            local_178 = (long *)*plVar6;
          }
          local_170 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_178,(ulong)local_1d8._M_dataplus._M_p);
          local_158 = &local_148;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_148 = *plVar9;
            lStack_140 = plVar6[3];
          }
          else {
            local_148 = *plVar9;
            local_158 = (long *)*plVar6;
          }
          local_150 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_138 = &local_128;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_128 = *plVar9;
            lStack_120 = plVar6[3];
          }
          else {
            local_128 = *plVar9;
            local_138 = (long *)*plVar6;
          }
          local_130 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_138,(ulong)local_1f8._M_dataplus._M_p);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1b8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_118.field_2._M_allocated_capacity = *psVar10;
            local_118.field_2._8_8_ = plVar6[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar10;
            local_118._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_118._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          CodeWriter::operator+=(local_258,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_298._M_unused._0_8_ != local_288) {
            operator_delete(local_298._M_unused._M_object,(ulong)(local_288._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(long *)((pSVar14->super_Definition).name._M_dataplus._M_p + 0x128) != 0) {
          local_278._M_string_length = 0;
          local_278.field_2._M_allocated_capacity =
               local_278.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_298._8_8_ = 0;
          local_298._M_unused._M_object = PaddingNoop;
          local_288._8_8_ =
               std::
               _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
               ::_M_invoke;
          local_288._0_8_ =
               std::
               _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
               ::_M_manager;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          GenPadding((FieldDef *)(pSVar14->super_Definition).name._M_dataplus._M_p,&local_278,
                     &local_224,
                     (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                      *)&local_298);
          if ((code *)local_288._0_8_ != (code *)0x0) {
            (*(code *)local_288._0_8_)(&local_298,&local_298,3);
          }
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_278._M_dataplus._M_p,
                     local_278._M_dataplus._M_p + local_278._M_string_length);
          CodeWriter::operator+=(local_258,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar14 = (StructDef *)&(pSVar14->super_Definition).name._M_string_length;
      } while (pSVar14 != local_200);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  }","");
    CodeWriter::operator+=(local_258,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                             local_198.field_2._M_local_buf[0]) + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
  }
  return;
}

Assistant:

void GenStructConstructor(const StructDef &struct_def,
                            GenArrayArgMode array_mode) {
    std::string arg_list;
    std::string init_list;
    int padding_id = 0;
    auto first = struct_def.fields.vec.begin();
    // skip arrays if generate ctor without array assignment
    const auto init_arrays = (array_mode != kArrayArgModeNone);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      const auto &type = field.value.type;
      const auto is_array = IsArray(type);
      const auto arg_name = "_" + Name(field);
      if (!is_array || init_arrays) {
        if (it != first && !arg_list.empty()) { arg_list += ", "; }
        arg_list += !is_array ? GenTypeGet(type, " ", "const ", " &", true)
                              : GenTypeSpan(type, true, type.fixed_length);
        arg_list += arg_name;
      }
      // skip an array with initialization from span
      if (false == (is_array && init_arrays)) {
        if (it != first && !init_list.empty()) { init_list += ",\n        "; }
        init_list += Name(field) + "_";
        if (IsScalar(type.base_type)) {
          auto scalar_type = GenUnderlyingCast(field, false, arg_name);
          init_list += "(::flatbuffers::EndianScalar(" + scalar_type + "))";
        } else {
          FLATBUFFERS_ASSERT((is_array && !init_arrays) || IsStruct(type));
          if (!is_array)
            init_list += "(" + arg_name + ")";
          else
            init_list += "()";
        }
      }
      if (field.padding)
        GenPadding(field, &init_list, &padding_id, PaddingInitializer);
    }

    if (!arg_list.empty()) {
      code_.SetValue("ARG_LIST", arg_list);
      code_.SetValue("INIT_LIST", init_list);
      if (!init_list.empty()) {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}})";
        code_ += "      : {{INIT_LIST}} {";
      } else {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}}) {";
      }
      padding_id = 0;
      for (const auto &field : struct_def.fields.vec) {
        const auto &type = field->value.type;
        if (IsArray(type) && init_arrays) {
          const auto &element_type = type.VectorType();
          const auto is_enum = IsEnum(element_type);
          FLATBUFFERS_ASSERT(
              (IsScalar(element_type.base_type) || IsStruct(element_type)) &&
              "invalid declaration");
          const auto face_type = GenTypeGet(type, " ", "", "", is_enum);
          std::string get_array =
              is_enum ? "CastToArrayOfEnum<" + face_type + ">" : "CastToArray";
          const auto field_name = Name(*field) + "_";
          const auto arg_name = "_" + Name(*field);
          code_ += "    ::flatbuffers::" + get_array + "(" + field_name +
                   ").CopyFromSpan(" + arg_name + ");";
        }
        if (field->padding) {
          std::string padding;
          GenPadding(*field, &padding, &padding_id, PaddingNoop);
          code_ += padding;
        }
      }
      code_ += "  }";
    }
  }